

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

void __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EnsureFlat(DescriptorIndex *this)

{
  DescriptorIndex *this_local;
  
  std::
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
  ::shrink_to_fit(&this->all_values_);
  MergeIntoFlat<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
            (&this->by_name_,&this->by_name_flat_);
  MergeIntoFlat<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
            (&this->by_symbol_,&this->by_symbol_flat_);
  MergeIntoFlat<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
            (&this->by_extension_,&this->by_extension_flat_);
  return;
}

Assistant:

void EncodedDescriptorDatabase::DescriptorIndex::EnsureFlat() {
  all_values_.shrink_to_fit();
  // Merge each of the sets into their flat counterpart.
  MergeIntoFlat(&by_name_, &by_name_flat_);
  MergeIntoFlat(&by_symbol_, &by_symbol_flat_);
  MergeIntoFlat(&by_extension_, &by_extension_flat_);
}